

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_mtree.c
# Opt level: O2

int mtree_entry_new(archive_write *a,archive_entry *entry,mtree_entry_conflict **m_entry)

{
  archive_string *as;
  uint uVar1;
  mode_t mVar2;
  mtree_entry_conflict *me;
  char *pcVar3;
  char *pcVar4;
  size_t sVar5;
  ulong uVar6;
  la_int64_t lVar7;
  time_t tVar8;
  long lVar9;
  dev_t dVar10;
  dir_info *pdVar11;
  reg_info *prVar12;
  size_t sVar13;
  char *pcVar14;
  int iVar15;
  long lVar16;
  bool bVar17;
  archive_string local_48;
  
  me = (mtree_entry_conflict *)calloc(1,0x150);
  if (me != (mtree_entry_conflict *)0x0) {
    pcVar3 = archive_entry_pathname(entry);
    pcVar4 = archive_entry_pathname(entry);
    if (pcVar4 == (char *)0x0) {
      sVar5 = 0;
    }
    else {
      pcVar4 = archive_entry_pathname(entry);
      sVar5 = strlen(pcVar4);
    }
    archive_strncat(&me->pathname,pcVar3,sVar5);
    pcVar3 = (me->pathname).s;
    if ((*pcVar3 != '.') || (pcVar3[1] != '\0')) {
      as = &me->parentdir;
      (me->parentdir).length = 0;
      sVar5 = strlen(pcVar3);
      archive_strncat(as,pcVar3,sVar5);
      sVar13 = (me->parentdir).length;
      pcVar3 = (me->parentdir).s;
      for (pcVar4 = pcVar3;
          (lVar9 = 1, lVar16 = -1, *pcVar4 == '/' ||
          (((*pcVar4 == '.' && (pcVar4[1] == '.')) && (lVar9 = 3, lVar16 = -3, pcVar4[2] == '/'))));
          pcVar4 = pcVar4 + lVar9) {
        sVar13 = sVar13 + lVar16;
      }
      if (pcVar4 != pcVar3) {
        memmove(pcVar3,pcVar4,sVar13 + 1);
      }
      do {
        pcVar4 = pcVar3;
        if (sVar13 == 0) break;
        uVar6 = sVar13;
        if (pcVar3[sVar13 - 1] == '/') {
          uVar6 = sVar13 - 1;
          pcVar3[uVar6] = '\0';
        }
        if (1 < uVar6) {
          if ((pcVar3[uVar6 - 2] == '/') && (pcVar3[uVar6 - 1] == '.')) {
            uVar6 = uVar6 - 2;
            pcVar3[uVar6] = '\0';
          }
          if (((2 < uVar6) && (pcVar3[uVar6 - 3] == '/')) &&
             ((pcVar3[uVar6 - 2] == '.' && (pcVar3[uVar6 - 1] == '.')))) {
            uVar6 = uVar6 - 3;
            pcVar3[uVar6] = '\0';
          }
        }
        bVar17 = sVar13 != uVar6;
        sVar13 = uVar6;
      } while (bVar17);
LAB_0040e54b:
      do {
        pcVar14 = pcVar4;
        if (*pcVar14 == '/') {
          pcVar4 = pcVar14 + 1;
          if (pcVar14[1] == '.') {
            if (pcVar14[2] == '.') {
              if (pcVar14[3] == '/') {
                pcVar4 = pcVar14;
                do {
                  pcVar4 = pcVar4 + -1;
                  if (pcVar4 < pcVar3) break;
                } while (*pcVar4 != '/');
                if (pcVar3 < pcVar4) {
                  strcpy(pcVar4,pcVar14 + 3);
                }
                else {
                  strcpy(pcVar3,pcVar14 + 4);
                  pcVar4 = pcVar3;
                }
              }
              goto LAB_0040e54b;
            }
            if (pcVar14[2] != '/') goto LAB_0040e54b;
            pcVar4 = pcVar14 + 2;
          }
          else if (pcVar14[1] != '/') goto LAB_0040e54b;
          strcpy(pcVar14,pcVar4);
          pcVar4 = pcVar14;
          goto LAB_0040e54b;
        }
        if (*pcVar14 == '\0') goto LAB_0040e5e6;
        pcVar4 = pcVar14 + 1;
      } while( true );
    }
    (me->basename).length = 0;
    pcVar4 = ".";
    sVar13 = 1;
    goto LAB_0040e6d5;
  }
  goto LAB_0040e90f;
LAB_0040e5e6:
  sVar13 = strlen(pcVar3);
  if ((*pcVar3 != '.') || ((pcVar3[1] != '\0' && (pcVar3[1] != '/')))) {
    local_48.s = (char *)0x0;
    local_48.length = 0;
    local_48.buffer_length = 0;
    archive_strncat(&local_48,"./",2);
    archive_strncat(&local_48,pcVar3,sVar13);
    (me->parentdir).length = 0;
    archive_string_concat(as,&local_48);
    archive_string_free(&local_48);
    pcVar3 = (me->parentdir).s;
    sVar13 = (me->parentdir).length;
  }
  pcVar4 = (char *)0x0;
  for (; (pcVar14 = pcVar3, *pcVar3 == '/' || (pcVar14 = pcVar4, *pcVar3 != '\0'));
      pcVar3 = pcVar3 + 1) {
    pcVar4 = pcVar14;
  }
  if (pcVar4 == (char *)0x0) {
    (me->parentdir).length = sVar13;
    (me->basename).length = 0;
    archive_string_concat(&me->basename,as);
    (me->parentdir).length = 0;
    *(me->parentdir).s = '\0';
  }
  else {
    *pcVar4 = '\0';
    (me->parentdir).length = (long)pcVar4 - (long)(me->parentdir).s;
    (me->basename).length = 0;
    pcVar4 = pcVar4 + 1;
    sVar13 = strlen(pcVar4);
LAB_0040e6d5:
    archive_strncat(&me->basename,pcVar4,sVar13);
  }
  pcVar3 = archive_entry_symlink(entry);
  if (pcVar3 != (char *)0x0) {
    (me->symlink).length = 0;
    sVar5 = strlen(pcVar3);
    archive_strncat(&me->symlink,pcVar3,sVar5);
  }
  uVar1 = archive_entry_nlink(entry);
  me->nlink = uVar1;
  mVar2 = archive_entry_filetype(entry);
  me->filetype = mVar2;
  mVar2 = archive_entry_mode(entry);
  me->mode = mVar2 & 0xfff;
  lVar7 = archive_entry_uid(entry);
  me->uid = lVar7;
  lVar7 = archive_entry_gid(entry);
  me->gid = lVar7;
  pcVar3 = archive_entry_uname(entry);
  if (pcVar3 != (char *)0x0) {
    (me->uname).length = 0;
    sVar5 = strlen(pcVar3);
    archive_strncat(&me->uname,pcVar3,sVar5);
  }
  pcVar3 = archive_entry_gname(entry);
  if (pcVar3 != (char *)0x0) {
    (me->gname).length = 0;
    sVar5 = strlen(pcVar3);
    archive_strncat(&me->gname,pcVar3,sVar5);
  }
  pcVar3 = archive_entry_fflags_text(entry);
  if (pcVar3 != (char *)0x0) {
    (me->fflags_text).length = 0;
    sVar5 = strlen(pcVar3);
    archive_strncat(&me->fflags_text,pcVar3,sVar5);
  }
  archive_entry_fflags(entry,&me->fflags_set,&me->fflags_clear);
  tVar8 = archive_entry_mtime(entry);
  me->mtime = tVar8;
  lVar9 = archive_entry_mtime_nsec(entry);
  me->mtime_nsec = lVar9;
  dVar10 = archive_entry_rdevmajor(entry);
  me->rdevmajor = dVar10;
  dVar10 = archive_entry_rdevminor(entry);
  me->rdevminor = dVar10;
  dVar10 = archive_entry_devmajor(entry);
  me->devmajor = dVar10;
  dVar10 = archive_entry_devminor(entry);
  me->devminor = dVar10;
  lVar7 = archive_entry_ino(entry);
  me->ino = lVar7;
  lVar7 = archive_entry_size(entry);
  me->size = lVar7;
  iVar15 = 0;
  if (me->filetype == 0x8000) {
    prVar12 = (reg_info *)calloc(1,8);
    me->reg_info = prVar12;
    if (prVar12 != (reg_info *)0x0) {
      prVar12->compute_sum = 0;
      goto LAB_0040e929;
    }
  }
  else {
    iVar15 = 0;
    if (me->filetype != 0x4000) goto LAB_0040e929;
    pdVar11 = (dir_info *)calloc(1,0x30);
    me->dir_info = pdVar11;
    if (pdVar11 != (dir_info *)0x0) {
      __archive_rb_tree_init((archive_rb_tree *)pdVar11,&mtree_entry_new::rb_ops);
      pdVar11 = me->dir_info;
      (pdVar11->children).first = (mtree_entry_conflict *)0x0;
      (pdVar11->children).last = &(pdVar11->children).first;
      pdVar11->chnext = (mtree_entry_conflict *)0x0;
      goto LAB_0040e929;
    }
  }
  mtree_entry_free(me);
LAB_0040e90f:
  me = (mtree_entry_conflict *)0x0;
  archive_set_error(&a->archive,0xc,"Can\'t allocate memory for a mtree entry");
  iVar15 = -0x1e;
LAB_0040e929:
  *m_entry = me;
  return iVar15;
}

Assistant:

static int
mtree_entry_new(struct archive_write *a, struct archive_entry *entry,
    struct mtree_entry **m_entry)
{
	struct mtree_entry *me;
	const char *s;
	int r;
	static const struct archive_rb_tree_ops rb_ops = {
		mtree_entry_cmp_node, mtree_entry_cmp_key
	};

	me = calloc(1, sizeof(*me));
	if (me == NULL) {
		archive_set_error(&a->archive, ENOMEM,
		    "Can't allocate memory for a mtree entry");
		*m_entry = NULL;
		return (ARCHIVE_FATAL);
	}

	r = mtree_entry_setup_filenames(a, me, entry);
	if (r < ARCHIVE_WARN) {
		mtree_entry_free(me);
		*m_entry = NULL;
		return (r);
	}

	if ((s = archive_entry_symlink(entry)) != NULL)
		archive_strcpy(&me->symlink, s);
	me->nlink = archive_entry_nlink(entry);
	me->filetype = archive_entry_filetype(entry);
	me->mode = archive_entry_mode(entry) & 07777;
	me->uid = archive_entry_uid(entry);
	me->gid = archive_entry_gid(entry);
	if ((s = archive_entry_uname(entry)) != NULL)
		archive_strcpy(&me->uname, s);
	if ((s = archive_entry_gname(entry)) != NULL)
		archive_strcpy(&me->gname, s);
	if ((s = archive_entry_fflags_text(entry)) != NULL)
		archive_strcpy(&me->fflags_text, s);
	archive_entry_fflags(entry, &me->fflags_set, &me->fflags_clear);
	me->mtime = archive_entry_mtime(entry);
	me->mtime_nsec = archive_entry_mtime_nsec(entry);
	me->rdevmajor = archive_entry_rdevmajor(entry);
	me->rdevminor = archive_entry_rdevminor(entry);
	me->devmajor = archive_entry_devmajor(entry);
	me->devminor = archive_entry_devminor(entry);
	me->ino = archive_entry_ino(entry);
	me->size = archive_entry_size(entry);
	if (me->filetype == AE_IFDIR) {
		me->dir_info = calloc(1, sizeof(*me->dir_info));
		if (me->dir_info == NULL) {
			mtree_entry_free(me);
			archive_set_error(&a->archive, ENOMEM,
			    "Can't allocate memory for a mtree entry");
			*m_entry = NULL;
			return (ARCHIVE_FATAL);
		}
		__archive_rb_tree_init(&me->dir_info->rbtree, &rb_ops);
		me->dir_info->children.first = NULL;
		me->dir_info->children.last = &(me->dir_info->children.first);
		me->dir_info->chnext = NULL;
	} else if (me->filetype == AE_IFREG) {
		me->reg_info = calloc(1, sizeof(*me->reg_info));
		if (me->reg_info == NULL) {
			mtree_entry_free(me);
			archive_set_error(&a->archive, ENOMEM,
			    "Can't allocate memory for a mtree entry");
			*m_entry = NULL;
			return (ARCHIVE_FATAL);
		}
		me->reg_info->compute_sum = 0;
	}

	*m_entry = me;
	return (ARCHIVE_OK);
}